

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

int Abc_AigLevel(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  uint local_28;
  int local_24;
  int LevelsMax;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x128,"int Abc_AigLevel(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs == 0) {
    local_28 = 0;
    for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_24);
      pAVar3 = Abc_ObjFanin0(pAVar2);
      if (local_28 < *(uint *)&pAVar3->field_0x14 >> 0xc) {
        pAVar2 = Abc_ObjFanin0(pAVar2);
        local_28 = *(uint *)&pAVar2->field_0x14 >> 0xc;
      }
    }
    pNtk_local._4_4_ = local_28;
  }
  else {
    pNtk_local._4_4_ = Abc_NtkLevel(pNtk);
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_AigLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    assert( Abc_NtkIsStrash(pNtk) );
    if ( pNtk->nBarBufs )
        return Abc_NtkLevel( pNtk );
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( LevelsMax < (int)Abc_ObjFanin0(pNode)->Level )
            LevelsMax = (int)Abc_ObjFanin0(pNode)->Level;
    return LevelsMax;
}